

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O1

void StringFormatter<unsigned_int,_unsigned_int_&,_const_char_*>::format(ostream *os,char *fmt)

{
  char cVar1;
  undefined8 in_RAX;
  runtime_error *this;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  while( true ) {
    while( true ) {
      cVar1 = *fmt;
      if (cVar1 != '%') break;
      if (fmt[1] != '%') {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"not enough arguments to format");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      fmt = fmt + 2;
      uStack_28._0_7_ = CONCAT16(0x25,(undefined6)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_28 + 6),1);
    }
    if (cVar1 == '\0') break;
    fmt = fmt + 1;
    uStack_28 = CONCAT17(cVar1,(undefined7)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_28 + 7),1);
  }
  return;
}

Assistant:

static void format(std::ostream&os, const char *fmt) 
    {
        const char *p= fmt;
        while (*p) {
            if (*p=='%') {
                p++;
                if (*p=='%') {
                    os << *p++;
                }
                else {
                    throw std::runtime_error("not enough arguments to format");
                }
            }
            else {
                os << *p++;
            }
        }
    }